

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_vector_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b24676::MotionVectorTestLarge::SetUp(MotionVectorTestLarge *this)

{
  libaom_test::EncoderTest::InitializeConfig
            (&this->super_EncoderTest,*(TestMode *)&(this->super_EncoderTest).field_0x3dc);
  if (*(int *)&(this->super_EncoderTest).field_0x3dc == 0) {
    (this->super_EncoderTest).cfg_.rc_buf_sz = 1000;
    (this->super_EncoderTest).cfg_.rc_buf_initial_sz = 500;
    (this->super_EncoderTest).cfg_.rc_buf_optimal_sz = 600;
  }
  else {
    (this->super_EncoderTest).cfg_.g_lag_in_frames = 3;
  }
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    if (encoding_mode_ != ::libaom_test::kRealTime) {
      cfg_.g_lag_in_frames = 3;
    } else {
      cfg_.rc_buf_sz = 1000;
      cfg_.rc_buf_initial_sz = 500;
      cfg_.rc_buf_optimal_sz = 600;
    }
  }